

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.h
# Opt level: O2

ssize_t __thiscall
booster::details::trace_manip::write(trace_manip *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  
  if (this->tr_ != (backtrace *)0x0) {
    backtrace::trace(this->tr_,(ostream *)CONCAT44(in_register_00000034,__fd));
  }
  return (ssize_t)(ostream *)CONCAT44(in_register_00000034,__fd);
}

Assistant:

std::ostream &write(std::ostream &out) const
            {
                if(tr_)
                    tr_->trace(out);
                return out;
            }